

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O0

bool __thiscall
cmDependsFortran::WriteDependenciesReal
          (cmDependsFortran *this,char *obj,cmFortranSourceInfo *info,string *mod_dir,
          char *stamp_dir,ostream *makeDepends,ostream *internalDepends)

{
  cmDependsFortranInternals *pcVar1;
  cmLocalGenerator *pcVar2;
  bool bVar3;
  char *pcVar4;
  ostream *poVar5;
  ulong uVar6;
  pointer ppVar7;
  reference pbVar8;
  cmMakefile *this_00;
  undefined1 auVar9 [16];
  string local_4a0;
  string local_480;
  undefined1 local_460 [8];
  string driver;
  string local_438;
  char *local_418;
  char *cid;
  cmMakefile *mf;
  string local_3e8;
  allocator local_3c1;
  undefined1 local_3c0 [8];
  string stampFile_1;
  string local_380;
  undefined1 local_360 [8];
  string modFile;
  string m;
  _Self local_310;
  _Self local_308;
  const_iterator i_3;
  string local_2e0;
  allocator local_2b9;
  undefined1 local_2b8 [8];
  string proxy_1;
  _Self local_290;
  const_iterator i_2;
  string local_268;
  undefined1 local_248 [8];
  string module;
  undefined1 local_208 [8];
  string stampFile;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e0;
  iterator local_1d8;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d0;
  const_iterator required;
  string local_1a8;
  allocator local_181;
  undefined1 local_180 [8];
  string proxy;
  _Self local_158;
  _Self local_150;
  _Self local_148;
  _Self local_140;
  _Self local_138;
  const_iterator i_1;
  string local_110;
  _Self local_f0;
  _Self local_e8;
  const_iterator i;
  string obj_m;
  string local_b8;
  undefined1 local_98 [8];
  string obj_i;
  allocator local_61;
  undefined1 local_60 [8];
  string binDir;
  char *src;
  ostream *makeDepends_local;
  char *stamp_dir_local;
  string *mod_dir_local;
  cmFortranSourceInfo *info_local;
  char *obj_local;
  cmDependsFortran *this_local;
  
  binDir.field_2._8_8_ = std::__cxx11::string::c_str();
  pcVar4 = cmLocalGenerator::GetBinaryDirectory((this->super_cmDepends).LocalGenerator);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_60,pcVar4,&local_61);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_b8,obj,(allocator *)(obj_m.field_2._M_local_buf + 0xf));
  MaybeConvertToRelativePath((string *)local_98,this,(string *)local_60,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator((allocator<char> *)(obj_m.field_2._M_local_buf + 0xf));
  auVar9 = std::__cxx11::string::c_str();
  cmSystemTools::ConvertToOutputPath_abi_cxx11_((string *)&i,auVar9._0_8_,auVar9._8_8_);
  poVar5 = std::operator<<(internalDepends,(string *)local_98);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<(internalDepends," ");
  poVar5 = std::operator<<(poVar5,(char *)binDir.field_2._8_8_);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  local_e8._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(&info->Includes);
  while( true ) {
    local_f0._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&info->Includes);
    bVar3 = std::operator!=(&local_e8,&local_f0);
    if (!bVar3) break;
    poVar5 = std::operator<<(makeDepends,(string *)&i);
    poVar5 = std::operator<<(poVar5,": ");
    pbVar8 = std::
             _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_e8);
    MaybeConvertToRelativePath((string *)&i_1,this,(string *)local_60,pbVar8);
    auVar9 = std::__cxx11::string::c_str();
    cmSystemTools::ConvertToOutputPath_abi_cxx11_(&local_110,auVar9._0_8_,auVar9._8_8_);
    poVar5 = std::operator<<(poVar5,(string *)&local_110);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&i_1);
    poVar5 = std::operator<<(internalDepends," ");
    pbVar8 = std::
             _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_e8);
    poVar5 = std::operator<<(poVar5,(string *)pbVar8);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_e8);
  }
  std::ostream::operator<<(makeDepends,std::endl<char,std::char_traits<char>>);
  local_138._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(&info->Requires);
  do {
    local_140._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&info->Requires);
    bVar3 = std::operator!=(&local_138,&local_140);
    if (!bVar3) {
      local_290._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&info->Provides);
      while( true ) {
        proxy_1.field_2._8_8_ =
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(&info->Provides);
        bVar3 = std::operator!=(&local_290,(_Self *)((long)&proxy_1.field_2 + 8));
        if (!bVar3) break;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)local_2b8,stamp_dir,&local_2b9);
        std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
        std::__cxx11::string::operator+=((string *)local_2b8,"/");
        pbVar8 = std::
                 _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_290);
        std::__cxx11::string::operator+=((string *)local_2b8,(string *)pbVar8);
        std::__cxx11::string::operator+=((string *)local_2b8,".mod.proxy");
        MaybeConvertToRelativePath((string *)&i_3,this,(string *)local_60,(string *)local_2b8);
        auVar9 = std::__cxx11::string::c_str();
        cmSystemTools::ConvertToOutputPath_abi_cxx11_(&local_2e0,auVar9._0_8_,auVar9._8_8_);
        std::__cxx11::string::operator=((string *)local_2b8,(string *)&local_2e0);
        std::__cxx11::string::~string((string *)&local_2e0);
        std::__cxx11::string::~string((string *)&i_3);
        poVar5 = std::operator<<(makeDepends,(string *)local_2b8);
        poVar5 = std::operator<<(poVar5,": ");
        poVar5 = std::operator<<(poVar5,(string *)&i);
        poVar5 = std::operator<<(poVar5,".provides");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string((string *)local_2b8);
        std::
        _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&local_290);
      }
      bVar3 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&info->Provides);
      if (!bVar3) {
        poVar5 = std::operator<<(makeDepends,(string *)&i);
        std::operator<<(poVar5,".provides.build:\n");
        local_308._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&info->Provides);
        while( true ) {
          local_310._M_node =
               (_Base_ptr)
               std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(&info->Provides);
          bVar3 = std::operator!=(&local_308,&local_310);
          if (!bVar3) break;
          pcVar1 = this->Internal;
          pbVar8 = std::
                   _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_308);
          std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(&pcVar1->TargetProvides,pbVar8);
          pbVar8 = std::
                   _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_308);
          cmsys::SystemTools::LowerCase((string *)((long)&modFile.field_2 + 8),pbVar8);
          std::__cxx11::string::string((string *)local_360,(string *)mod_dir);
          std::__cxx11::string::operator+=((string *)local_360,"/");
          pbVar8 = std::
                   _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_308);
          std::__cxx11::string::operator+=((string *)local_360,(string *)pbVar8);
          pcVar2 = (this->super_cmDepends).LocalGenerator;
          MaybeConvertToRelativePath
                    ((string *)((long)&stampFile_1.field_2 + 8),this,(string *)local_60,
                     (string *)local_360);
          cmOutputConverter::ConvertToOutputFormat
                    (&local_380,&pcVar2->super_cmOutputConverter,
                     (string *)((long)&stampFile_1.field_2 + 8),SHELL);
          std::__cxx11::string::operator=((string *)local_360,(string *)&local_380);
          std::__cxx11::string::~string((string *)&local_380);
          std::__cxx11::string::~string((string *)(stampFile_1.field_2._M_local_buf + 8));
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)local_3c0,stamp_dir,&local_3c1);
          std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
          std::__cxx11::string::operator+=((string *)local_3c0,"/");
          std::__cxx11::string::operator+=
                    ((string *)local_3c0,(string *)(modFile.field_2._M_local_buf + 8));
          std::__cxx11::string::operator+=((string *)local_3c0,".mod.stamp");
          pcVar2 = (this->super_cmDepends).LocalGenerator;
          MaybeConvertToRelativePath((string *)&mf,this,(string *)local_60,(string *)local_3c0);
          cmOutputConverter::ConvertToOutputFormat
                    (&local_3e8,&pcVar2->super_cmOutputConverter,(string *)&mf,SHELL);
          std::__cxx11::string::operator=((string *)local_3c0,(string *)&local_3e8);
          std::__cxx11::string::~string((string *)&local_3e8);
          std::__cxx11::string::~string((string *)&mf);
          poVar5 = std::operator<<(makeDepends,"\t$(CMAKE_COMMAND) -E cmake_copy_f90_mod ");
          poVar5 = std::operator<<(poVar5,(string *)local_360);
          poVar5 = std::operator<<(poVar5," ");
          std::operator<<(poVar5,(string *)local_3c0);
          this_00 = cmLocalGenerator::GetMakefile((this->super_cmDepends).LocalGenerator);
          cid = (char *)this_00;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_438,"CMAKE_Fortran_COMPILER_ID",
                     (allocator *)(driver.field_2._M_local_buf + 0xf));
          pcVar4 = cmMakefile::GetDefinition(this_00,&local_438);
          std::__cxx11::string::~string((string *)&local_438);
          std::allocator<char>::~allocator((allocator<char> *)(driver.field_2._M_local_buf + 0xf));
          local_418 = pcVar4;
          if ((pcVar4 != (char *)0x0) && (*pcVar4 != '\0')) {
            poVar5 = std::operator<<(makeDepends," ");
            std::operator<<(poVar5,local_418);
          }
          std::operator<<(makeDepends,"\n");
          std::__cxx11::string::~string((string *)local_3c0);
          std::__cxx11::string::~string((string *)local_360);
          std::__cxx11::string::~string((string *)(modFile.field_2._M_local_buf + 8));
          std::
          _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator++(&local_308);
        }
        poVar5 = std::operator<<(makeDepends,"\t$(CMAKE_COMMAND) -E touch ");
        poVar5 = std::operator<<(poVar5,(string *)&i);
        std::operator<<(poVar5,".provides.build\n");
        std::__cxx11::string::string
                  ((string *)local_460,(string *)&(this->super_cmDepends).TargetDirectory);
        std::__cxx11::string::operator+=((string *)local_460,"/build");
        MaybeConvertToRelativePath(&local_4a0,this,(string *)local_60,(string *)local_460);
        auVar9 = std::__cxx11::string::c_str();
        cmSystemTools::ConvertToOutputPath_abi_cxx11_(&local_480,auVar9._0_8_,auVar9._8_8_);
        std::__cxx11::string::operator=((string *)local_460,(string *)&local_480);
        std::__cxx11::string::~string((string *)&local_480);
        std::__cxx11::string::~string((string *)&local_4a0);
        poVar5 = std::operator<<(makeDepends,(string *)local_460);
        poVar5 = std::operator<<(poVar5,": ");
        poVar5 = std::operator<<(poVar5,(string *)&i);
        std::operator<<(poVar5,".provides.build\n");
        std::__cxx11::string::~string((string *)local_460);
      }
      std::__cxx11::string::~string((string *)&i);
      std::__cxx11::string::~string((string *)local_98);
      std::__cxx11::string::~string((string *)local_60);
      return true;
    }
    pbVar8 = std::
             _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_138);
    local_148._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::find(&info->Provides,pbVar8);
    local_150._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&info->Provides);
    bVar3 = std::operator!=(&local_148,&local_150);
    if (!bVar3) {
      pcVar1 = this->Internal;
      pbVar8 = std::
               _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_138);
      local_158._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::find(&pcVar1->TargetProvides,pbVar8);
      proxy.field_2._8_8_ =
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&this->Internal->TargetProvides);
      bVar3 = std::operator!=(&local_158,(_Self *)((long)&proxy.field_2 + 8));
      if (bVar3) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)local_180,stamp_dir,&local_181);
        std::allocator<char>::~allocator((allocator<char> *)&local_181);
        std::__cxx11::string::operator+=((string *)local_180,"/");
        pbVar8 = std::
                 _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_138);
        std::__cxx11::string::operator+=((string *)local_180,(string *)pbVar8);
        std::__cxx11::string::operator+=((string *)local_180,".mod.proxy");
        MaybeConvertToRelativePath((string *)&required,this,(string *)local_60,(string *)local_180);
        auVar9 = std::__cxx11::string::c_str();
        cmSystemTools::ConvertToOutputPath_abi_cxx11_(&local_1a8,auVar9._0_8_,auVar9._8_8_);
        std::__cxx11::string::operator=((string *)local_180,(string *)&local_1a8);
        std::__cxx11::string::~string((string *)&local_1a8);
        std::__cxx11::string::~string((string *)&required);
        poVar5 = std::operator<<(makeDepends,(string *)&i);
        poVar5 = std::operator<<(poVar5,".requires: ");
        poVar5 = std::operator<<(poVar5,(string *)local_180);
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string((string *)local_180);
      }
      pcVar1 = this->Internal;
      pbVar8 = std::
               _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_138);
      local_1d8._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(&pcVar1->TargetRequires,pbVar8);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_Rb_tree_const_iterator(&local_1d0,&local_1d8);
      stampFile.field_2._8_8_ =
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end(&this->Internal->TargetRequires);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_Rb_tree_const_iterator(&local_1e0,(iterator *)((long)&stampFile.field_2 + 8));
      bVar3 = std::operator==(&local_1d0,&local_1e0);
      if (bVar3) {
        abort();
      }
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator->(&local_1d0);
      uVar6 = std::__cxx11::string::empty();
      if ((uVar6 & 1) == 0) {
        ppVar7 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator->(&local_1d0);
        MaybeConvertToRelativePath
                  ((string *)((long)&module.field_2 + 8),this,(string *)local_60,&ppVar7->second);
        auVar9 = std::__cxx11::string::c_str();
        cmSystemTools::ConvertToOutputPath_abi_cxx11_((string *)local_208,auVar9._0_8_,auVar9._8_8_)
        ;
        std::__cxx11::string::~string((string *)(module.field_2._M_local_buf + 8));
        poVar5 = std::operator<<(makeDepends,(string *)&i);
        poVar5 = std::operator<<(poVar5,": ");
        poVar5 = std::operator<<(poVar5,(string *)local_208);
        std::operator<<(poVar5,"\n");
        std::__cxx11::string::~string((string *)local_208);
      }
      else {
        std::__cxx11::string::string((string *)local_248);
        pbVar8 = std::
                 _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_138);
        bVar3 = FindModule(this,pbVar8,(string *)local_248);
        if (bVar3) {
          MaybeConvertToRelativePath((string *)&i_2,this,(string *)local_60,(string *)local_248);
          auVar9 = std::__cxx11::string::c_str();
          cmSystemTools::ConvertToOutputPath_abi_cxx11_(&local_268,auVar9._0_8_,auVar9._8_8_);
          std::__cxx11::string::operator=((string *)local_248,(string *)&local_268);
          std::__cxx11::string::~string((string *)&local_268);
          std::__cxx11::string::~string((string *)&i_2);
          poVar5 = std::operator<<(makeDepends,(string *)&i);
          poVar5 = std::operator<<(poVar5,": ");
          poVar5 = std::operator<<(poVar5,(string *)local_248);
          std::operator<<(poVar5,"\n");
        }
        std::__cxx11::string::~string((string *)local_248);
      }
    }
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_138);
  } while( true );
}

Assistant:

bool cmDependsFortran::WriteDependenciesReal(const char* obj,
                                             cmFortranSourceInfo const& info,
                                             std::string const& mod_dir,
                                             const char* stamp_dir,
                                             std::ostream& makeDepends,
                                             std::ostream& internalDepends)
{
  typedef cmDependsFortranInternals::TargetRequiresMap TargetRequiresMap;

  // Get the source file for this object.
  const char* src = info.Source.c_str();

  // Write the include dependencies to the output stream.
  std::string binDir = this->LocalGenerator->GetBinaryDirectory();
  std::string obj_i = this->MaybeConvertToRelativePath(binDir, obj);
  std::string obj_m = cmSystemTools::ConvertToOutputPath(obj_i.c_str());
  internalDepends << obj_i << std::endl;
  internalDepends << " " << src << std::endl;
  for (std::set<std::string>::const_iterator i = info.Includes.begin();
       i != info.Includes.end(); ++i) {
    makeDepends << obj_m << ": "
                << cmSystemTools::ConvertToOutputPath(
                     this->MaybeConvertToRelativePath(binDir, *i).c_str())
                << std::endl;
    internalDepends << " " << *i << std::endl;
  }
  makeDepends << std::endl;

  // Write module requirements to the output stream.
  for (std::set<std::string>::const_iterator i = info.Requires.begin();
       i != info.Requires.end(); ++i) {
    // Require only modules not provided in the same source.
    if (std::set<std::string>::const_iterator(info.Provides.find(*i)) !=
        info.Provides.end()) {
      continue;
    }

    // If the module is provided in this target special handling is
    // needed.
    if (this->Internal->TargetProvides.find(*i) !=
        this->Internal->TargetProvides.end()) {
      // The module is provided by a different source in the same
      // target.  Add the proxy dependency to make sure the other
      // source builds first.
      std::string proxy = stamp_dir;
      proxy += "/";
      proxy += *i;
      proxy += ".mod.proxy";
      proxy = cmSystemTools::ConvertToOutputPath(
        this->MaybeConvertToRelativePath(binDir, proxy).c_str());

      // since we require some things add them to our list of requirements
      makeDepends << obj_m << ".requires: " << proxy << std::endl;
    }

    // The object file should depend on timestamped files for the
    // modules it uses.
    TargetRequiresMap::const_iterator required =
      this->Internal->TargetRequires.find(*i);
    if (required == this->Internal->TargetRequires.end()) {
      abort();
    }
    if (!required->second.empty()) {
      // This module is known.  Depend on its timestamp file.
      std::string stampFile = cmSystemTools::ConvertToOutputPath(
        this->MaybeConvertToRelativePath(binDir, required->second).c_str());
      makeDepends << obj_m << ": " << stampFile << "\n";
    } else {
      // This module is not known to CMake.  Try to locate it where
      // the compiler will and depend on that.
      std::string module;
      if (this->FindModule(*i, module)) {
        module = cmSystemTools::ConvertToOutputPath(
          this->MaybeConvertToRelativePath(binDir, module).c_str());
        makeDepends << obj_m << ": " << module << "\n";
      }
    }
  }

  // Write provided modules to the output stream.
  for (std::set<std::string>::const_iterator i = info.Provides.begin();
       i != info.Provides.end(); ++i) {
    std::string proxy = stamp_dir;
    proxy += "/";
    proxy += *i;
    proxy += ".mod.proxy";
    proxy = cmSystemTools::ConvertToOutputPath(
      this->MaybeConvertToRelativePath(binDir, proxy).c_str());
    makeDepends << proxy << ": " << obj_m << ".provides" << std::endl;
  }

  // If any modules are provided then they must be converted to stamp files.
  if (!info.Provides.empty()) {
    // Create a target to copy the module after the object file
    // changes.
    makeDepends << obj_m << ".provides.build:\n";
    for (std::set<std::string>::const_iterator i = info.Provides.begin();
         i != info.Provides.end(); ++i) {
      // Include this module in the set provided by this target.
      this->Internal->TargetProvides.insert(*i);

      // Always use lower case for the mod stamp file name.  The
      // cmake_copy_f90_mod will call back to this class, which will
      // try various cases for the real mod file name.
      std::string m = cmSystemTools::LowerCase(*i);
      std::string modFile = mod_dir;
      modFile += "/";
      modFile += *i;
      modFile = this->LocalGenerator->ConvertToOutputFormat(
        this->MaybeConvertToRelativePath(binDir, modFile),
        cmOutputConverter::SHELL);
      std::string stampFile = stamp_dir;
      stampFile += "/";
      stampFile += m;
      stampFile += ".mod.stamp";
      stampFile = this->LocalGenerator->ConvertToOutputFormat(
        this->MaybeConvertToRelativePath(binDir, stampFile),
        cmOutputConverter::SHELL);
      makeDepends << "\t$(CMAKE_COMMAND) -E cmake_copy_f90_mod " << modFile
                  << " " << stampFile;
      cmMakefile* mf = this->LocalGenerator->GetMakefile();
      const char* cid = mf->GetDefinition("CMAKE_Fortran_COMPILER_ID");
      if (cid && *cid) {
        makeDepends << " " << cid;
      }
      makeDepends << "\n";
    }
    // After copying the modules update the timestamp file so that
    // copying will not be done again until the source rebuilds.
    makeDepends << "\t$(CMAKE_COMMAND) -E touch " << obj_m
                << ".provides.build\n";

    // Make sure the module timestamp rule is evaluated by the time
    // the target finishes building.
    std::string driver = this->TargetDirectory;
    driver += "/build";
    driver = cmSystemTools::ConvertToOutputPath(
      this->MaybeConvertToRelativePath(binDir, driver).c_str());
    makeDepends << driver << ": " << obj_m << ".provides.build\n";
  }

  return true;
}